

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_node __thiscall
pugi::xml_node::find_child_by_attribute
          (xml_node *this,char_t *name_,char_t *attr_name,char_t *attr_value)

{
  xml_node_struct *p;
  bool bVar1;
  char_t *dst;
  xml_attribute_struct *pxVar2;
  xml_node local_40;
  char_t *local_38;
  
  local_38 = name_;
  if (this->_root != (xml_node_struct *)0x0) {
    for (p = this->_root->first_child; p != (xml_node_struct *)0x0; p = p->next_sibling) {
      if ((p->name != (char_t *)0x0) &&
         (bVar1 = impl::anon_unknown_0::strequal(local_38,p->name), bVar1)) {
        for (pxVar2 = p->first_attribute; pxVar2 != (xml_attribute_struct *)0x0;
            pxVar2 = pxVar2->next_attribute) {
          if ((pxVar2->name != (char_t *)0x0) &&
             (bVar1 = impl::anon_unknown_0::strequal(attr_name,pxVar2->name), bVar1)) {
            dst = pxVar2->value;
            if (dst == (char_t *)0x0) {
              dst = "";
            }
            bVar1 = impl::anon_unknown_0::strequal(attr_value,dst);
            if (bVar1) {
              xml_node(&local_40,p);
              if (pxVar2 != (xml_attribute_struct *)0x0) {
                if (p != (xml_node_struct *)0x0) {
                  return (xml_node)local_40._root;
                }
                goto LAB_0011f070;
              }
              break;
            }
          }
        }
      }
    }
  }
LAB_0011f070:
  xml_node(&local_40);
  return (xml_node)local_40._root;
}

Assistant:

PUGI__FN xml_node xml_node::find_child_by_attribute(const char_t* name_, const char_t* attr_name, const char_t* attr_value) const
	{
		if (!_root) return xml_node();

		for (xml_node_struct* i = _root->first_child; i; i = i->next_sibling)
			if (i->name && impl::strequal(name_, i->name))
			{
				for (xml_attribute_struct* a = i->first_attribute; a; a = a->next_attribute)
					if (a->name && impl::strequal(attr_name, a->name) && impl::strequal(attr_value, a->value ? a->value + 0 : PUGIXML_TEXT("")))
						return xml_node(i);
			}

		return xml_node();
	}